

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_hashtable.cpp
# Opt level: O2

idx_t __thiscall
duckdb::JoinHashTable::PrepareKeys
          (JoinHashTable *this,DataChunk *keys,
          vector<duckdb::TupleDataVectorFormat,_true> *vector_data,SelectionVector **current_sel,
          SelectionVector *sel,bool build_side)

{
  sel_t *psVar1;
  bool bVar2;
  SelectionVector *pSVar3;
  reference pvVar4;
  idx_t result_count;
  idx_t iVar5;
  idx_t row_idx;
  undefined3 in_register_00000089;
  idx_t i;
  idx_t iVar6;
  ulong __n;
  idx_t iVar7;
  reference rVar8;
  idx_t local_70;
  
  pSVar3 = FlatVector::IncrementalSelectionVector();
  *current_sel = pSVar3;
  local_70 = keys->count;
  if ((CONCAT31(in_register_00000089,build_side) == 0) ||
     (bVar2 = PropagatesBuildSide(this->join_type), !bVar2)) {
    for (__n = 0; __n < (ulong)(((long)(keys->data).
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(keys->data).
                                      super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                      ._M_impl.super__Vector_impl_data._M_start) / 0x68);
        __n = __n + 1) {
      if ((((this->join_type != MARK) ||
           ((this->correlated_mark_join_info).correlated_types.
            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_start ==
            (this->correlated_mark_join_info).correlated_types.
            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_finish)) &&
          (rVar8 = vector<bool,_true>::get<true>(&this->null_values_are_equal,__n),
          (*rVar8._M_p & rVar8._M_mask) == 0)) &&
         (pvVar4 = vector<duckdb::TupleDataVectorFormat,_true>::get<true>(vector_data,__n),
         (pvVar4->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
         (unsigned_long *)0x0)) {
        pSVar3 = *current_sel;
        iVar5 = 0;
        for (iVar6 = 0; local_70 != iVar6; iVar6 = iVar6 + 1) {
          iVar7 = iVar6;
          if (pSVar3->sel_vector != (sel_t *)0x0) {
            iVar7 = (idx_t)pSVar3->sel_vector[iVar6];
          }
          psVar1 = ((pvVar4->unified).sel)->sel_vector;
          row_idx = iVar7;
          if (psVar1 != (sel_t *)0x0) {
            row_idx = (idx_t)psVar1[iVar7];
          }
          bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                            (&(pvVar4->unified).validity.super_TemplatedValidityMask<unsigned_long>,
                             row_idx);
          if (bVar2) {
            sel->sel_vector[iVar5] = (sel_t)iVar7;
            iVar5 = iVar5 + 1;
          }
        }
        *current_sel = sel;
        local_70 = iVar5;
      }
    }
  }
  return local_70;
}

Assistant:

idx_t JoinHashTable::PrepareKeys(DataChunk &keys, vector<TupleDataVectorFormat> &vector_data,
                                 const SelectionVector *&current_sel, SelectionVector &sel, bool build_side) {
	// figure out which keys are NULL, and create a selection vector out of them
	current_sel = FlatVector::IncrementalSelectionVector();
	idx_t added_count = keys.size();
	if (build_side && PropagatesBuildSide(join_type)) {
		// in case of a right or full outer join, we cannot remove NULL keys from the build side
		return added_count;
	}

	for (idx_t col_idx = 0; col_idx < keys.ColumnCount(); col_idx++) {
		// see internal issue 3717.
		if (join_type == JoinType::MARK && !correlated_mark_join_info.correlated_types.empty()) {
			continue;
		}
		if (null_values_are_equal[col_idx]) {
			continue;
		}
		auto &col_key_data = vector_data[col_idx].unified;
		if (col_key_data.validity.AllValid()) {
			continue;
		}
		added_count = FilterNullValues(col_key_data, *current_sel, added_count, sel);
		// null values are NOT equal for this column, filter them out
		current_sel = &sel;
	}
	return added_count;
}